

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_StArrAtomic<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  char cVar1;
  uchar uVar2;
  unsigned_short uVar3;
  short sVar4;
  uint uVar5;
  long value;
  code *pcVar6;
  bool bVar7;
  char cVar8;
  uchar uVar9;
  unsigned_short uVar10;
  short sVar11;
  uint byteLength;
  int iVar12;
  uint uVar13;
  int iVar14;
  undefined4 *puVar15;
  WebAssemblyMemory *this_00;
  ArrayBufferBase *pAVar16;
  undefined4 extraout_var;
  unsigned_short *puVar17;
  uint *puVar18;
  int *piVar19;
  long *buffer_00;
  long lVar20;
  short *psVar21;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  ulong index;
  byte *buffer;
  
  bVar7 = Wasm::Threads::IsEnabled();
  if (!bVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2372,"(Wasm::Threads::IsEnabled())","Wasm::Threads::IsEnabled()")
    ;
    if (!bVar7) goto LAB_00a61fb3;
    *puVar15 = 0;
  }
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2373,"(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT)",
                                "playout->ViewType < Js::ArrayBufferView::TYPE_COUNT");
    if (!bVar7) goto LAB_00a61fb3;
    *puVar15 = 0;
  }
  uVar5 = playout->Offset;
  uVar13 = *(uint *)(*(long *)(this + 0x118) + (ulong)playout->SlotIndex * 4);
  this_00 = GetWebAssemblyMemory(this);
  pAVar16 = WebAssemblyMemory::GetBuffer(this_00);
  byteLength = (*(pAVar16->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])(pAVar16);
  iVar12 = (*(pAVar16->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])(pAVar16);
  buffer = (byte *)CONCAT44(extraout_var,iVar12);
  if (playout->ViewType < TYPE_COUNT) {
    index = (ulong)uVar13 + (ulong)uVar5;
    switch(playout->ViewType) {
    case TYPE_INT8:
      if (byteLength <= index) {
LAB_00a61fb5:
        JavascriptError::ThrowWebAssemblyRuntimeError
                  (*(ScriptContext **)(this + 0x78),-0x7ff5e497,(PCWSTR)0x0);
      }
      cVar1 = *(char *)(*(long *)(this + 0x118) + (ulong)playout->Value * 4);
      cVar8 = AtomicsOperations::Store<char>((char *)(buffer + index),cVar1);
      if (cVar1 == cVar8) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
      ;
      error = "(storedValue == value)";
      message = "storedValue == value";
      lineNumber = 0x15;
      break;
    case TYPE_UINT8:
      if (byteLength <= index) goto LAB_00a61fb5;
      uVar2 = *(uchar *)(*(long *)(this + 0x118) + (ulong)playout->Value * 4);
      uVar9 = AtomicsOperations::Store<unsigned_char>(buffer + index,uVar2);
      if (uVar9 == uVar2) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
      ;
      error = "(storedValue == value)";
      message = "storedValue == value";
      lineNumber = 0x16;
      break;
    case TYPE_INT16:
      psVar21 = WasmAtomicsArrayBoundsCheck<short>(this,buffer,index,byteLength);
      sVar4 = *(short *)(*(long *)(this + 0x118) + (ulong)playout->Value * 4);
      sVar11 = AtomicsOperations::Store<short>(psVar21,sVar4);
      if (sVar4 == sVar11) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
      ;
      error = "(storedValue == value)";
      message = "storedValue == value";
      lineNumber = 0x17;
      break;
    case TYPE_UINT16:
      puVar17 = WasmAtomicsArrayBoundsCheck<unsigned_short>(this,buffer,index,byteLength);
      uVar3 = *(unsigned_short *)(*(long *)(this + 0x118) + (ulong)playout->Value * 4);
      uVar10 = AtomicsOperations::Store<unsigned_short>(puVar17,uVar3);
      if (uVar10 == uVar3) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
      ;
      error = "(storedValue == value)";
      message = "storedValue == value";
      lineNumber = 0x18;
      break;
    case TYPE_INT32:
      piVar19 = WasmAtomicsArrayBoundsCheck<int>(this,buffer,index,byteLength);
      iVar12 = *(int *)(*(long *)(this + 0x118) + (ulong)playout->Value * 4);
      iVar14 = AtomicsOperations::Store<int>(piVar19,iVar12);
      if (iVar14 == iVar12) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
      ;
      error = "(storedValue == value)";
      message = "storedValue == value";
      lineNumber = 0x19;
      break;
    case TYPE_UINT32:
      puVar18 = WasmAtomicsArrayBoundsCheck<unsigned_int>(this,buffer,index,byteLength);
      uVar5 = *(uint *)(*(long *)(this + 0x118) + (ulong)playout->Value * 4);
      uVar13 = AtomicsOperations::Store<unsigned_int>(puVar18,uVar5);
      if (uVar13 == uVar5) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
      ;
      error = "(storedValue == value)";
      message = "storedValue == value";
      lineNumber = 0x1a;
      break;
    default:
      goto switchD_00a61903_caseD_6;
    case TYPE_INT64:
      buffer_00 = WasmAtomicsArrayBoundsCheck<long>(this,buffer,index,byteLength);
      value = *(long *)(*(long *)(this + 0x120) + (ulong)playout->Value * 8);
      lVar20 = AtomicsOperations::Store<long>(buffer_00,value);
      if (lVar20 == value) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
      ;
      error = "(storedValue == value)";
      message = "storedValue == value";
      lineNumber = 0x1d;
      break;
    case TYPE_INT8_TO_INT64:
      if (byteLength <= index) goto LAB_00a61fb5;
      cVar1 = *(char *)(*(long *)(this + 0x120) + (ulong)playout->Value * 8);
      cVar8 = AtomicsOperations::Store<char>((char *)(buffer + index),cVar1);
      if (cVar8 == cVar1) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
      ;
      error = "(storedValue == value)";
      message = "storedValue == value";
      lineNumber = 0x1e;
      break;
    case TYPE_UINT8_TO_INT64:
      if (byteLength <= index) goto LAB_00a61fb5;
      uVar2 = *(uchar *)(*(long *)(this + 0x120) + (ulong)playout->Value * 8);
      uVar9 = AtomicsOperations::Store<unsigned_char>(buffer + index,uVar2);
      if (uVar9 == uVar2) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
      ;
      error = "(storedValue == value)";
      message = "storedValue == value";
      lineNumber = 0x1f;
      break;
    case TYPE_INT16_TO_INT64:
      psVar21 = WasmAtomicsArrayBoundsCheck<short>(this,buffer,index,byteLength);
      sVar4 = *(short *)(*(long *)(this + 0x120) + (ulong)playout->Value * 8);
      sVar11 = AtomicsOperations::Store<short>(psVar21,sVar4);
      if (sVar11 == sVar4) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
      ;
      error = "(storedValue == value)";
      message = "storedValue == value";
      lineNumber = 0x20;
      break;
    case TYPE_UINT16_TO_INT64:
      puVar17 = WasmAtomicsArrayBoundsCheck<unsigned_short>(this,buffer,index,byteLength);
      uVar3 = *(unsigned_short *)(*(long *)(this + 0x120) + (ulong)playout->Value * 8);
      uVar10 = AtomicsOperations::Store<unsigned_short>(puVar17,uVar3);
      if (uVar10 == uVar3) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
      ;
      error = "(storedValue == value)";
      message = "storedValue == value";
      lineNumber = 0x21;
      break;
    case TYPE_INT32_TO_INT64:
      piVar19 = WasmAtomicsArrayBoundsCheck<int>(this,buffer,index,byteLength);
      iVar12 = *(int *)(*(long *)(this + 0x120) + (ulong)playout->Value * 8);
      iVar14 = AtomicsOperations::Store<int>(piVar19,iVar12);
      if (iVar14 == iVar12) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
      ;
      error = "(storedValue == value)";
      message = "storedValue == value";
      lineNumber = 0x22;
      break;
    case TYPE_UINT32_TO_INT64:
      puVar18 = WasmAtomicsArrayBoundsCheck<unsigned_int>(this,buffer,index,byteLength);
      uVar5 = *(uint *)(*(long *)(this + 0x120) + (ulong)playout->Value * 8);
      uVar13 = AtomicsOperations::Store<unsigned_int>(puVar18,uVar5);
      if (uVar13 == uVar5) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
      ;
      error = "(storedValue == value)";
      message = "storedValue == value";
      lineNumber = 0x23;
    }
  }
  else {
switchD_00a61903_caseD_6:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
    ;
    error = "((0))";
    message = "UNREACHED";
    lineNumber = 0x2384;
  }
  bVar7 = Throw::ReportAssert(fileName,lineNumber,error,message);
  if (bVar7) {
    *puVar15 = 0;
    return;
  }
LAB_00a61fb3:
  pcVar6 = (code *)invalidInstructionException();
  (*pcVar6)();
}

Assistant:

void InterpreterStackFrame::OP_StArrAtomic(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        Assert(Wasm::Threads::IsEnabled());
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);
        const uint64 index = playout->Offset + (uint64)(uint32)GetRegRawInt(playout->SlotIndex);
        ArrayBufferBase* arr = GetWebAssemblyMemory()->GetBuffer();

        uint32 byteLength = arr->GetByteLength();
        BYTE* buffer = arr->GetBuffer();
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW_INT(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: {\
            MemType* readBuffer = WasmAtomicsArrayBoundsCheck<MemType>(buffer, index, byteLength); \
            MemType value = (MemType)GetRegRaw<RegType>(playout->Value); \
            MemType storedValue = AtomicsOperations::Store<MemType>(readBuffer, value); \
            Assert(storedValue == value); \
            return; \
        }
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
#else
        Assert(UNREACHED);
#endif
    }